

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O0

void do_scroll_short_agg_proc(Am_Object *param_1)

{
  int iVar1;
  Am_Value *pAVar2;
  float fVar3;
  float fVar4;
  float ratio_y;
  float ratio_x;
  Am_Object *param_0_local;
  
  fVar3 = get_long_short_ratio_x();
  fVar4 = get_long_short_ratio_y();
  pAVar2 = (Am_Value *)Am_Object::Get(0x3428,100);
  iVar1 = Am_Value::operator_cast_to_int(pAVar2);
  Am_Object::Set(0x33d8,0x11d,(ulong)(uint)(int)((float)iVar1 / fVar3));
  pAVar2 = (Am_Value *)Am_Object::Get(0x3428,0x65);
  iVar1 = Am_Value::operator_cast_to_int(pAVar2);
  Am_Object::Set(0x33d8,0x11e,(ulong)(uint)(int)((float)iVar1 / fVar4));
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_scroll_short_agg,
                 (Am_Object /* command */))
{
  float ratio_x = get_long_short_ratio_x();
  float ratio_y = get_long_short_ratio_y();

  //constraints set the SP_Short_Agg based on the scroll bars
  SP_Scroll_Agg.Set(Am_X_OFFSET,
                    (int)((int)(SP_Long_Feed.Get(Am_LEFT)) / ratio_x));
  SP_Scroll_Agg.Set(Am_Y_OFFSET,
                    (int)((int)(SP_Long_Feed.Get(Am_TOP)) / ratio_y));
}